

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMarkers::IntLoadResidual_F(ChLinkMarkers *this,uint off,ChVectorDynamic<> *R,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ChBodyFrame *pCVar50;
  ChMarker *pCVar51;
  int iVar52;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar53;
  double *pdVar54;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Index index;
  ulong uVar55;
  ulong uVar56;
  undefined4 in_register_00000034;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  double dVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  Vector m_abs_force;
  Vector mbody_torque;
  Vector mbody_force;
  ChVector<double> local_90;
  ChVector<double> local_78;
  double local_58 [3];
  ulong local_40;
  double local_38;
  ulong local_30;
  ChVector<double> local_28;
  
  if (((this->super_ChLink).Body1 != (ChBodyFrame *)0x0) &&
     (pCVar50 = (this->super_ChLink).Body2, pCVar50 != (ChBodyFrame *)0x0)) {
    local_28.m_data[0] = 0.0;
    local_28.m_data[1] = 0.0;
    local_28.m_data[2] = 0.0;
    local_78.m_data[2] = 0.0;
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    dVar86 = (this->C_force).m_data[0];
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar86;
    dVar1 = (this->C_force).m_data[1];
    if ((dVar86 != 0.0) ||
       ((((NAN(dVar86) || (dVar1 != 0.0)) || (NAN(dVar1))) ||
        ((dVar86 = (this->C_force).m_data[2], dVar86 != 0.0 || (NAN(dVar86))))))) {
      pCVar51 = this->marker2;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar73._8_8_ = 0;
      auVar73._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
      auVar2 = vfmadd231sd_fma(auVar73,auVar57,auVar2);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = (this->C_force).m_data[2];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar2 = vfmadd231sd_fma(auVar2,auVar79,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[3];
      auVar87._8_8_ = 0;
      auVar87._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
      auVar3 = vfmadd231sd_fma(auVar87,auVar57,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
      auVar3 = vfmadd231sd_fma(auVar3,auVar79,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar67._8_8_ = 0;
      auVar67._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
      auVar57 = vfmadd231sd_fma(auVar67,auVar57,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar57 = vfmadd231sd_fma(auVar57,auVar79,auVar7);
      dVar86 = auVar3._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar58._8_8_ = 0;
      auVar58._0_8_ =
           dVar86 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
      auVar3 = vfmadd231sd_fma(auVar58,auVar2,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar3 = vfmadd231sd_fma(auVar3,auVar57,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar80._8_8_ = 0;
      auVar80._0_8_ =
           dVar86 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
      auVar4 = vfmadd231sd_fma(auVar80,auVar2,auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar4 = vfmadd231sd_fma(auVar4,auVar57,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar88._8_8_ = 0;
      auVar88._0_8_ =
           dVar86 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[7];
      auVar2 = vfmadd231sd_fma(auVar88,auVar2,auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar57 = vfmadd231sd_fma(auVar2,auVar57,auVar13);
      local_90.m_data[0] = auVar3._0_8_;
      local_90.m_data[1] = auVar4._0_8_;
      local_90.m_data[2] = auVar57._0_8_;
      iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])
                         (pCVar50,CONCAT44(in_register_00000034,off));
      if (*(char *)(CONCAT44(extraout_var,iVar52) + 0x2c) == '\0') {
        ChBodyFrame::To_abs_forcetorque
                  ((this->super_ChLink).Body2,&local_90,
                   &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&local_28,
                   &local_78);
        iVar52 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>
                   ._vptr_ChFrame[0x10])();
        lVar53 = (long)*(int *)(CONCAT44(extraout_var_00,iVar52) + 0x30);
        if ((lVar53 < 0) ||
           ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
            -3 < lVar53)) goto LAB_0058b6de;
        pdVar54 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + lVar53;
        uVar55 = 3;
        if ((((ulong)pdVar54 & 7) == 0) &&
           (uVar56 = (ulong)(-((uint)((ulong)pdVar54 >> 3) & 0x1fffffff) & 7), uVar56 < 3)) {
          uVar55 = uVar56;
        }
        if (uVar55 != 0) {
          uVar56 = 0;
          do {
            pdVar54[uVar56] = pdVar54[uVar56] - c * local_28.m_data[uVar56];
            uVar56 = uVar56 + 1;
          } while (uVar55 != uVar56);
        }
        if (uVar55 < 3) {
          do {
            pdVar54[uVar55] = pdVar54[uVar55] - c * local_28.m_data[uVar55];
            uVar55 = uVar55 + 1;
          } while (uVar55 != 3);
        }
        pCVar50 = (this->super_ChLink).Body2;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_78.m_data[0];
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        auVar74._8_8_ = 0;
        auVar74._0_8_ =
             local_78.m_data[1] *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
        auVar57 = vfmadd231sd_fma(auVar74,auVar59,auVar14);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = local_78.m_data[2];
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
        auVar57 = vfmadd231sd_fma(auVar57,auVar81,auVar15);
        auVar16._8_8_ = 0;
        auVar16._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        auVar89._8_8_ = 0;
        auVar89._0_8_ =
             local_78.m_data[1] *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        auVar2 = vfmadd231sd_fma(auVar89,auVar59,auVar16);
        auVar17._8_8_ = 0;
        auVar17._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar2 = vfmadd231sd_fma(auVar2,auVar81,auVar17);
        auVar18._8_8_ = 0;
        auVar18._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
        auVar68._8_8_ = 0;
        auVar68._0_8_ =
             local_78.m_data[1] *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
        auVar3 = vfmadd231sd_fma(auVar68,auVar59,auVar18);
        auVar19._8_8_ = 0;
        auVar19._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar3 = vfmadd231sd_fma(auVar3,auVar81,auVar19);
        local_58[0] = auVar57._0_8_;
        local_58[1] = auVar2._0_8_;
        local_58[2] = auVar3._0_8_;
        iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])
                           ();
        iVar52 = *(int *)(CONCAT44(extraout_var_01,iVar52) + 0x30);
        if ((iVar52 < -3) ||
           (lVar53 = (long)(iVar52 + 3),
           (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
           < lVar53)) goto LAB_0058b6de;
        pdVar54 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + lVar53;
        uVar55 = 3;
        if ((((ulong)pdVar54 & 7) == 0) &&
           (uVar56 = (ulong)(-((uint)((ulong)pdVar54 >> 3) & 0x1fffffff) & 7), uVar56 < 3)) {
          uVar55 = uVar56;
        }
        if (uVar55 != 0) {
          uVar56 = 0;
          do {
            pdVar54[uVar56] = pdVar54[uVar56] - c * local_58[uVar56];
            uVar56 = uVar56 + 1;
          } while (uVar55 != uVar56);
        }
        if (uVar55 < 3) {
          do {
            pdVar54[uVar55] = pdVar54[uVar55] - c * local_58[uVar55];
            uVar55 = uVar55 + 1;
          } while (uVar55 != 3);
        }
      }
      iVar52 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                 _vptr_ChFrame[0x10])();
      if (*(char *)(CONCAT44(extraout_var_02,iVar52) + 0x2c) == '\0') {
        ChBodyFrame::To_abs_forcetorque
                  ((this->super_ChLink).Body1,&local_90,
                   &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&local_28,
                   &local_78);
        iVar52 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>
                   ._vptr_ChFrame[0x10])();
        lVar53 = (long)*(int *)(CONCAT44(extraout_var_03,iVar52) + 0x30);
        if ((lVar53 < 0) ||
           ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
            -3 < lVar53)) goto LAB_0058b6de;
        pdVar54 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + lVar53;
        uVar55 = 3;
        if ((((ulong)pdVar54 & 7) == 0) &&
           (uVar56 = (ulong)(-((uint)((ulong)pdVar54 >> 3) & 0x1fffffff) & 7), uVar56 < 3)) {
          uVar55 = uVar56;
        }
        if (uVar55 != 0) {
          uVar56 = 0;
          do {
            pdVar54[uVar56] = c * local_28.m_data[uVar56] + pdVar54[uVar56];
            uVar56 = uVar56 + 1;
          } while (uVar55 != uVar56);
        }
        if (uVar55 < 3) {
          do {
            pdVar54[uVar55] = c * local_28.m_data[uVar55] + pdVar54[uVar55];
            uVar55 = uVar55 + 1;
          } while (uVar55 != 3);
        }
        pCVar50 = (this->super_ChLink).Body1;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_78.m_data[0];
        auVar20._8_8_ = 0;
        auVar20._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        auVar75._8_8_ = 0;
        auVar75._0_8_ =
             local_78.m_data[1] *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
        auVar57 = vfmadd231sd_fma(auVar75,auVar60,auVar20);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = local_78.m_data[2];
        auVar21._8_8_ = 0;
        auVar21._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
        auVar57 = vfmadd231sd_fma(auVar57,auVar82,auVar21);
        auVar22._8_8_ = 0;
        auVar22._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        auVar90._8_8_ = 0;
        auVar90._0_8_ =
             local_78.m_data[1] *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        auVar2 = vfmadd231sd_fma(auVar90,auVar60,auVar22);
        auVar23._8_8_ = 0;
        auVar23._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar2 = vfmadd231sd_fma(auVar2,auVar82,auVar23);
        auVar24._8_8_ = 0;
        auVar24._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
        auVar69._8_8_ = 0;
        auVar69._0_8_ =
             local_78.m_data[1] *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
        auVar3 = vfmadd231sd_fma(auVar69,auVar60,auVar24);
        auVar25._8_8_ = 0;
        auVar25._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar3 = vfmadd231sd_fma(auVar3,auVar82,auVar25);
        local_58[0] = auVar57._0_8_;
        local_58[1] = auVar2._0_8_;
        local_58[2] = auVar3._0_8_;
        iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])
                           ();
        iVar52 = *(int *)(CONCAT44(extraout_var_04,iVar52) + 0x30);
        if ((iVar52 < -3) ||
           (lVar53 = (long)(iVar52 + 3),
           (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
           < lVar53)) goto LAB_0058b6de;
        pdVar54 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + lVar53;
        uVar55 = 3;
        if ((((ulong)pdVar54 & 7) == 0) &&
           (uVar56 = (ulong)(-((uint)((ulong)pdVar54 >> 3) & 0x1fffffff) & 7), uVar56 < 3)) {
          uVar55 = uVar56;
        }
        if (uVar55 != 0) {
          uVar56 = 0;
          do {
            pdVar54[uVar56] = c * local_58[uVar56] + pdVar54[uVar56];
            uVar56 = uVar56 + 1;
          } while (uVar55 != uVar56);
        }
        if (uVar55 < 3) {
          do {
            pdVar54[uVar55] = c * local_58[uVar55] + pdVar54[uVar55];
            uVar55 = uVar55 + 1;
          } while (uVar55 != 3);
        }
      }
    }
    dVar86 = (this->C_torque).m_data[0];
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar86;
    dVar1 = (this->C_torque).m_data[1];
    if ((((dVar86 == 0.0) && (!NAN(dVar86))) && (dVar1 == 0.0)) &&
       (((!NAN(dVar1) && (dVar86 = (this->C_torque).m_data[2], dVar86 == 0.0)) && (!NAN(dVar86)))))
    {
      return;
    }
    pCVar50 = (this->super_ChLink).Body2;
    pCVar51 = this->marker2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar76._8_8_ = 0;
    auVar76._0_8_ =
         dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
    auVar57 = vfmadd231sd_fma(auVar76,auVar61,auVar26);
    auVar83._8_8_ = 0;
    auVar83._0_8_ = (this->C_torque).m_data[2];
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar57 = vfmadd231sd_fma(auVar57,auVar83,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar2 = vfmadd231sd_fma(auVar91,auVar61,auVar28);
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar2 = vfmadd231sd_fma(auVar2,auVar83,auVar29);
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar70._8_8_ = 0;
    auVar70._0_8_ =
         dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
    auVar3 = vfmadd231sd_fma(auVar70,auVar61,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar3 = vfmadd231sd_fma(auVar3,auVar83,auVar31);
    dVar86 = auVar2._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         dVar86 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar2 = vfmadd231sd_fma(auVar62,auVar57,auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar33);
    local_30 = auVar2._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         dVar86 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar2 = vfmadd231sd_fma(auVar63,auVar57,auVar34);
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar35);
    local_38 = auVar2._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar64._8_8_ = 0;
    auVar64._0_8_ =
         dVar86 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar57 = vfmadd231sd_fma(auVar64,auVar57,auVar36);
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar57 = vfmadd231sd_fma(auVar57,auVar3,auVar37);
    local_40 = auVar57._0_8_;
    iVar52 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
               _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var_05,iVar52) + 0x2c) == '\0') {
      pCVar50 = (this->super_ChLink).Body1;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_30;
      auVar38._8_8_ = 0;
      auVar38._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar65._8_8_ = 0;
      auVar65._0_8_ =
           local_38 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar57 = vfmadd231sd_fma(auVar65,auVar84,auVar38);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_40;
      auVar39._8_8_ = 0;
      auVar39._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar57 = vfmadd231sd_fma(auVar57,auVar92,auVar39);
      auVar40._8_8_ = 0;
      auVar40._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar71._8_8_ = 0;
      auVar71._0_8_ =
           local_38 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar2 = vfmadd231sd_fma(auVar71,auVar84,auVar40);
      auVar41._8_8_ = 0;
      auVar41._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar2 = vfmadd231sd_fma(auVar2,auVar92,auVar41);
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar77._8_8_ = 0;
      auVar77._0_8_ =
           local_38 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar3 = vfmadd231sd_fma(auVar77,auVar84,auVar42);
      auVar43._8_8_ = 0;
      auVar43._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar92,auVar43);
      local_90.m_data[0] = auVar57._0_8_;
      local_90.m_data[1] = auVar2._0_8_;
      local_90.m_data[2] = auVar3._0_8_;
      iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      iVar52 = *(int *)(CONCAT44(extraout_var_06,iVar52) + 0x30);
      if ((iVar52 < -3) ||
         (lVar53 = (long)(iVar52 + 3),
         (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
         lVar53)) goto LAB_0058b6de;
      pdVar54 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar53;
      uVar55 = 3;
      if ((((ulong)pdVar54 & 7) == 0) &&
         (uVar56 = (ulong)(-((uint)((ulong)pdVar54 >> 3) & 0x1fffffff) & 7), uVar56 < 3)) {
        uVar55 = uVar56;
      }
      if (uVar55 != 0) {
        uVar56 = 0;
        do {
          pdVar54[uVar56] = c * local_90.m_data[uVar56] + pdVar54[uVar56];
          uVar56 = uVar56 + 1;
        } while (uVar55 != uVar56);
      }
      if (uVar55 < 3) {
        do {
          pdVar54[uVar55] = c * local_90.m_data[uVar55] + pdVar54[uVar55];
          uVar55 = uVar55 + 1;
        } while (uVar55 != 3);
      }
    }
    iVar52 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
               _vptr_ChFrame[0x10])();
    if (*(char *)(CONCAT44(extraout_var_07,iVar52) + 0x2c) == '\0') {
      pCVar50 = (this->super_ChLink).Body2;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_30;
      auVar44._8_8_ = 0;
      auVar44._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar66._8_8_ = 0;
      auVar66._0_8_ =
           local_38 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar57 = vfmadd231sd_fma(auVar66,auVar85,auVar44);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = local_40;
      auVar45._8_8_ = 0;
      auVar45._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar57 = vfmadd231sd_fma(auVar57,auVar93,auVar45);
      auVar46._8_8_ = 0;
      auVar46._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar72._8_8_ = 0;
      auVar72._0_8_ =
           local_38 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar2 = vfmadd231sd_fma(auVar72,auVar85,auVar46);
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar2 = vfmadd231sd_fma(auVar2,auVar93,auVar47);
      auVar48._8_8_ = 0;
      auVar48._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar78._8_8_ = 0;
      auVar78._0_8_ =
           local_38 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar3 = vfmadd231sd_fma(auVar78,auVar85,auVar48);
      auVar49._8_8_ = 0;
      auVar49._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar93,auVar49);
      local_90.m_data[0] = auVar57._0_8_;
      local_90.m_data[1] = auVar2._0_8_;
      local_90.m_data[2] = auVar3._0_8_;
      iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      iVar52 = *(int *)(CONCAT44(extraout_var_08,iVar52) + 0x30);
      if ((iVar52 < -3) ||
         (lVar53 = (long)(iVar52 + 3),
         (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
         lVar53)) {
LAB_0058b6de:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar54 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar53;
      uVar55 = 3;
      if ((((ulong)pdVar54 & 7) == 0) &&
         (uVar56 = (ulong)(-((uint)((ulong)pdVar54 >> 3) & 0x1fffffff) & 7), uVar56 < 3)) {
        uVar55 = uVar56;
      }
      if (uVar55 != 0) {
        uVar56 = 0;
        do {
          pdVar54[uVar56] = pdVar54[uVar56] - c * local_90.m_data[uVar56];
          uVar56 = uVar56 + 1;
        } while (uVar55 != uVar56);
      }
      if (uVar55 < 3) {
        do {
          pdVar54[uVar55] = pdVar54[uVar55] - c * local_90.m_data[uVar55];
          uVar55 = uVar55 + 1;
        } while (uVar55 != 3);
      }
    }
  }
  return;
}

Assistant:

void ChLinkMarkers::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    if (!Body1 || !Body2)
        return;

    Vector mbody_force;
    Vector mbody_torque;
    if (Vnotnull(C_force)) {
        Vector m_abs_force = Body2->GetA() * (marker2->GetA() * C_force);

        if (Body2->Variables().IsActive()) {
            Body2->To_abs_forcetorque(m_abs_force,
                                      marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                      false,                       // from abs. space
                                      mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
            R.segment(Body2->Variables().GetOffset() + 0, 3) -= c * mbody_force.eigen();
            R.segment(Body2->Variables().GetOffset() + 3, 3) -=
                c * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();
        }

        if (Body1->Variables().IsActive()) {
            Body1->To_abs_forcetorque(m_abs_force,
                                      marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                      false,                       // from abs. space
                                      mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
            R.segment(Body1->Variables().GetOffset() + 0, 3) += c * mbody_force.eigen();
            R.segment(Body1->Variables().GetOffset() + 3, 3) +=
                c * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
        }
    }
    if (Vnotnull(C_torque)) {
        Vector m_abs_torque = Body2->GetA() * (marker2->GetA() * C_torque);
        // load torques in 'fb' vector accumulator of body variables (torques in local coords)
        if (Body1->Variables().IsActive()) {
            R.segment(Body1->Variables().GetOffset() + 3, 3) +=
                c * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
        }
        if (Body2->Variables().IsActive()) {
            R.segment(Body2->Variables().GetOffset() + 3, 3) -=
                c * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
        }
    }
}